

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_16U,_buffer_layout_bfs>::operator()
          (fill<64U,_16U,_buffer_layout_bfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  int iVar6;
  ostream *poVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  size_t n0;
  long lVar10;
  size_t sVar11;
  unsigned_long uVar12;
  fill<64U,_32U,_buffer_layout_bfs> local_5c;
  fill<64U,_33U,_buffer_layout_bfs> local_5b;
  fill<64U,_33U,_buffer_layout_bfs> local_5a;
  fill<64U,_32U,_buffer_layout_bfs> local_59;
  uchar **local_58;
  array<Stream,_64UL> *local_50;
  DI __d;
  
  local_50 = streams;
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"fill_inner");
  poVar7 = std::operator<<(poVar7,", inner, I=");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 0x20;
  puVar2 = buffer_count->_M_elems + 0x21;
  local_58 = buffer + 0x106c;
  n0 = 0;
  lVar10 = 0;
  do {
    uVar9 = *puVar1;
    if (uVar9 == 0) {
      fill<64U,_32U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"left stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar9 = *puVar2;
        goto LAB_001429ff;
      }
    }
    uVar12 = *puVar2;
    if (uVar12 == 0) {
      fill<64U,_33U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar12 = *puVar2;
      if (uVar12 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"right stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar9 = *puVar1;
        goto LAB_00142acb;
      }
      uVar9 = *puVar1;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"L:\'");
    ppuVar3 = buffer + (0x1103 - uVar9);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar3);
    poVar7 = std::operator<<(poVar7,"\', R:\'");
    ppuVar5 = buffer + (0x111a - uVar12);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar5);
    std::operator<<(poVar7,"\'\n");
    iVar6 = cmp(*ppuVar3,*ppuVar5);
    puVar8 = puVar2;
    if (iVar6 < 1) {
      puVar8 = puVar1;
      ppuVar5 = ppuVar3;
    }
    puVar4 = *ppuVar5;
    *puVar8 = *puVar8 - 1;
    buffer[n0 + 0x106c] = puVar4;
    check_input(local_58,n0);
    lVar10 = lVar10 + -8;
    n0 = n0 + 1;
  } while (n0 != 8);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"Done, buffer filled\n");
  buffer_count->_M_elems[0x10] = 8;
  goto LAB_00142c2d;
LAB_001429ff:
  do {
    if (uVar9 == 0) {
      fill<64U,_33U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar9 = *puVar2;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar10 + 0x1074,local_58,sVar11);
        buffer_count->_M_elems[0x10] = -lVar10;
        check_input((uchar **)((long)buffer + (0x83a0 - sVar11)),-lVar10);
        goto LAB_00142c2d;
      }
    }
    *(uchar **)((long)buffer + sVar11 + 0x8360) = buffer[0x111a - uVar9];
    uVar9 = uVar9 - 1;
    *puVar2 = uVar9;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x40);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"\tbuffer filled\n");
  buffer_count->_M_elems[0x10] = 8;
  check_input(local_58,8);
  goto LAB_00142c2d;
LAB_00142acb:
  do {
    if (uVar9 == 0) {
      fill<64U,_32U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar10 + 0x1074,local_58,sVar11);
        buffer_count->_M_elems[0x10] = -lVar10;
        check_input((uchar **)((long)buffer + (0x83a0 - sVar11)),-lVar10);
        goto LAB_00142c2d;
      }
    }
    *(uchar **)((long)buffer + sVar11 + 0x8360) = buffer[0x1103 - uVar9];
    uVar9 = uVar9 - 1;
    *puVar1 = uVar9;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x40);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"buffer filled\n");
  buffer_count->_M_elems[0x10] = 8;
  check_input(local_58,8);
LAB_00142c2d:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}